

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_t sVar8;
  FILE *__s;
  uint *puVar9;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  int err;
  int err_00;
  undefined8 uVar11;
  ostream *poVar12;
  byte bVar13;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string logmailer;
  string cmd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined4 local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_31;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    local_5c = (undefined4)CONCAT71(in_register_00000009,use_logging);
    if (use_logging) {
      if (SendEmailInternal::vlocal__.level == (int32 *)0x0) {
        bVar5 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                            ,1);
        if (bVar5) goto LAB_00117333;
      }
      else if (0 < *SendEmailInternal::vlocal__.level) {
LAB_00117333:
        LogMessage::LogMessage
                  ((LogMessage *)local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x869);
        poVar12 = (ostream *)(logmailer._M_dataplus._M_p + 0x7538);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Trying to send TITLE:",0x15);
        if (subject == (char *)0x0) {
          std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
        }
        else {
          sVar8 = strlen(subject);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,subject,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," BODY:",6);
        if (body == (char *)0x0) {
          std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
        }
        else {
          sVar8 = strlen(body);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,body,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," to ",4);
        sVar8 = strlen(dest);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,dest,sVar8);
        LogMessage::~LogMessage((LogMessage *)local_c0);
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,body,dest);
    }
    local_c0 = (undefined1  [8])&logmailer._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c0,*fLS::FLAGS_logmailer_abi_cxx11_,
               fLS::FLAGS_logmailer_abi_cxx11_[1] + *fLS::FLAGS_logmailer_abi_cxx11_);
    if (logmailer._M_dataplus._M_p == (pointer)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,0,0,
                 "/bin/mail",9);
    }
    paVar2 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_c0,logmailer._M_dataplus._M_p + (long)local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_e0," -s");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,subject,&local_31);
    ShellEscape(&local_120,&local_160);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      uVar11 = local_e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_120._M_string_length + local_e0._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        uVar11 = local_120.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_120._M_string_length + local_e0._M_string_length) goto LAB_0011752c;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_120,0,0,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    }
    else {
LAB_0011752c:
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_e0,local_120._M_dataplus._M_p,local_120._M_string_length);
    }
    cmd.field_2._8_8_ = &local_70;
    paVar1 = &pbVar7->field_2;
    pcVar3 = (pbVar7->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      local_70._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_70._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_70._M_allocated_capacity = paVar1->_M_allocated_capacity;
      cmd.field_2._8_8_ = pcVar3;
    }
    sVar4 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar7->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&cmd.field_2 + 8)," ");
    paVar1 = &local_58.field_2;
    paVar10 = &pbVar7->field_2;
    local_58._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar10) {
      local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_58._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_58.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_58._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    sVar8 = strlen(dest);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,dest,dest + sVar8);
    ShellEscape(&local_100,&local_140);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      uVar11 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_58._M_string_length + local_100._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar11 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_58._M_string_length + local_100._M_string_length) goto LAB_00117668;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_100,0,0,local_58._M_dataplus._M_p,local_58._M_string_length);
    }
    else {
LAB_00117668:
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_58,local_100._M_dataplus._M_p,local_100._M_string_length);
    }
    logmailer.field_2._8_8_ = &cmd._M_string_length;
    paVar10 = &pbVar7->field_2;
    pcVar3 = (pbVar7->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar10) {
      cmd._M_string_length = paVar10->_M_allocated_capacity;
      cmd.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar7->field_2 + 8);
    }
    else {
      cmd._M_string_length = paVar10->_M_allocated_capacity;
      logmailer.field_2._8_8_ = pcVar3;
    }
    cmd._M_dataplus._M_p = (pointer)pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    paVar10->_M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmd.field_2._8_8_ != &local_70) {
      operator_delete((void *)cmd.field_2._8_8_,local_70._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level == (int32 *)0x0)
    {
      bVar5 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__,
                          &fLI::FLAGS_v,
                          "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                          ,4);
      if (bVar5) goto LAB_001177cb;
    }
    else if (3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level) {
LAB_001177cb:
      LogMessage::LogMessage
                ((LogMessage *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x877);
      poVar12 = (ostream *)(local_58._M_string_length + 0x7538);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Mailing command: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,(char *)logmailer.field_2._8_8_,(long)cmd._M_dataplus._M_p);
      LogMessage::~LogMessage((LogMessage *)&local_58);
    }
    __s = popen((char *)logmailer.field_2._8_8_,"w");
    if (__s == (FILE *)0x0) {
      if ((char)local_5c == '\0') {
        fprintf(_stderr,"Unable to send mail to %s\n",dest);
      }
      else {
        LogMessage::LogMessage
                  ((LogMessage *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                   ,0x88b,2);
        poVar12 = (ostream *)(local_58._M_string_length + 0x7538);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Unable to send mail to ",0x17);
        sVar8 = strlen(dest);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,dest,sVar8);
        LogMessage::~LogMessage((LogMessage *)&local_58);
      }
    }
    else {
      if (body != (char *)0x0) {
        sVar8 = strlen(body);
        fwrite(body,1,sVar8,__s);
      }
      iVar6 = pclose(__s);
      body = (char *)0x1;
      if (iVar6 == -1) {
        if ((char)local_5c == '\0') {
          puVar9 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_58,(google *)(ulong)*puVar9,err_00);
          SendEmailInternal();
        }
        else {
          LogMessage::LogMessage
                    ((LogMessage *)((long)&cmd.field_2 + 8),
                     "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                     ,0x881,2);
          poVar12 = (ostream *)(sVar4 + 0x7538);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"Problems sending mail to ",0x19);
          sVar8 = strlen(dest);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,dest,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
          puVar9 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_58,(google *)(ulong)*puVar9,err);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,local_58._M_dataplus._M_p,local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          LogMessage::~LogMessage((LogMessage *)((long)&cmd.field_2 + 8));
        }
        body = (char *)0x0;
      }
    }
    bVar13 = (byte)body;
    if ((size_type *)logmailer.field_2._8_8_ != &cmd._M_string_length) {
      operator_delete((void *)logmailer.field_2._8_8_,cmd._M_string_length + 1);
    }
    if (local_c0 != (undefined1  [8])&logmailer._M_string_length) {
      operator_delete((void *)local_c0,logmailer._M_string_length + 1);
    }
    if (__s != (FILE *)0x0) goto LAB_001179c9;
  }
  bVar13 = 0;
LAB_001179c9:
  return (bool)(bVar13 & 1);
}

Assistant:

static bool SendEmailInternal(const char*dest, const char *subject,
                              const char*body, bool use_logging) {
#ifndef __EMSCRIPTEN__
  if (dest && *dest) {
    if ( use_logging ) {
      VLOG(1) << "Trying to send TITLE:" << subject
              << " BODY:" << body << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n",
              subject, body, dest);
    }

    string logmailer = FLAGS_logmailer;
    if (logmailer.empty()) {
        logmailer = "/bin/mail";
    }
    string cmd =
        logmailer + " -s" +
        ShellEscape(subject) + " " + ShellEscape(dest);
    VLOG(4) << "Mailing command: " << cmd;

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != NULL) {
      // Add the body if we have one
      if (body)
        fwrite(body, sizeof(char), strlen(body), pipe);
      bool ok = pclose(pipe) != -1;
      if ( !ok ) {
        if ( use_logging ) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n",
                  dest, StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if ( use_logging ) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
#endif
  return false;
}